

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

TRef lj_ir_kslot(jit_State *J,TRef key,IRRef slot)

{
  IRIns *pIVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  pIVar1 = (J->cur).ir;
  uVar3 = slot << 0x10 | key & 0xffff;
  for (uVar2 = J->chain[0x1e]; uVar2 != 0; uVar2 = *(ushort *)((long)pIVar1 + (ulong)uVar2 * 8 + 6))
  {
    uVar4 = (uint)uVar2;
    if (pIVar1[uVar2].field_1.op12 == uVar3) goto LAB_0012d710;
  }
  uVar4 = (J->cur).nk;
  if (uVar4 <= J->irbotlim) {
    lj_ir_growbot(J);
    pIVar1 = (J->cur).ir;
  }
  uVar4 = uVar4 - 1;
  uVar5 = (ulong)uVar4;
  (J->cur).nk = uVar4;
  pIVar1[uVar5].field_1.op12 = uVar3;
  *(undefined2 *)((long)pIVar1 + uVar5 * 8 + 4) = 0x1e05;
  *(IRRef1 *)((long)pIVar1 + uVar5 * 8 + 6) = J->chain[0x1e];
  J->chain[0x1e] = (IRRef1)uVar4;
LAB_0012d710:
  return uVar4 + 0x5000000;
}

Assistant:

TRef lj_ir_kslot(jit_State *J, TRef key, IRRef slot)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef2 op12 = IRREF2((IRRef1)key, (IRRef1)slot);
  IRRef ref;
  /* Const part is not touched by CSE/DCE, so 0-65535 is ok for IRMlit here. */
  lj_assertJ(tref_isk(key) && slot == (IRRef)(IRRef1)slot,
	     "out-of-range key/slot");
  for (ref = J->chain[IR_KSLOT]; ref; ref = cir[ref].prev)
    if (cir[ref].op12 == op12)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->op12 = op12;
  ir->t.irt = IRT_P32;
  ir->o = IR_KSLOT;
  ir->prev = J->chain[IR_KSLOT];
  J->chain[IR_KSLOT] = (IRRef1)ref;
found:
  return TREF(ref, IRT_P32);
}